

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BinTree.h
# Opt level: O1

void __thiscall
axl::sl::
BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
::erase(BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
        *this,Iterator it)

{
  if ((*(long *)((long)it.
                       super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
                       .
                       super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
                       .m_p + 0x48) != 0) &&
     (*(long *)((long)it.
                      super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
                      .
                      super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
                      .m_p + 0x50) != 0)) {
    xcg(this,(RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)
             it.
             super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
             .
             super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
             .m_p,
        *(RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> **)
         it.
         super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
         .
         super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
         .m_p);
  }
  RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
  ::onErase((RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
             *)this,(Node *)it.
                            super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
                            .
                            super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
                            .m_p);
  OwningListBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>_>
  ::erase((OwningListBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>_>
           *)this,(Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
                   )it.
                    super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
                    .
                    super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
                    .m_p);
  return;
}

Assistant:

void
	erase(Iterator it) {
		Node* node = *it;

		if (node->m_left && node->m_right) {
			Node* next = (Node*)node->m_next;
			ASSERT(next == getLeftmostChild(node->m_right));
			xcg(node, next);
		}

		static_cast<T*>(this)->onErase(node);
		m_nodeList.erase(node);
	}